

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,string *newFlags)

{
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  
  pbVar5 = (byte *)(newFlags->_M_dataplus)._M_p;
  uVar2 = newFlags->_M_string_length;
  pbVar1 = pbVar5 + uVar2;
  pbVar4 = pbVar5;
  if (0 < (long)uVar2 >> 2) {
    pbVar4 = pbVar5 + (uVar2 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar2 >> 2) + 1;
    pbVar5 = pbVar5 + 3;
    do {
      iVar3 = isspace((uint)pbVar5[-3]);
      if (iVar3 == 0) {
        pbVar5 = pbVar5 + -3;
        goto LAB_002dc8b7;
      }
      iVar3 = isspace((uint)pbVar5[-2]);
      if (iVar3 == 0) {
        pbVar5 = pbVar5 + -2;
        goto LAB_002dc8b7;
      }
      iVar3 = isspace((uint)pbVar5[-1]);
      if (iVar3 == 0) {
        pbVar5 = pbVar5 + -1;
        goto LAB_002dc8b7;
      }
      iVar3 = isspace((uint)*pbVar5);
      if (iVar3 == 0) goto LAB_002dc8b7;
      lVar6 = lVar6 + -1;
      pbVar5 = pbVar5 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pbVar1 - (long)pbVar4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pbVar5 = pbVar1;
      if ((lVar6 != 3) || (iVar3 = isspace((uint)*pbVar4), pbVar5 = pbVar4, iVar3 == 0))
      goto LAB_002dc8b7;
      pbVar4 = pbVar4 + 1;
    }
    iVar3 = isspace((uint)*pbVar4);
    pbVar5 = pbVar4;
    if (iVar3 == 0) goto LAB_002dc8b7;
    pbVar4 = pbVar4 + 1;
  }
  iVar3 = isspace((uint)*pbVar4);
  pbVar5 = pbVar4;
  if (iVar3 != 0) {
    pbVar5 = pbVar1;
  }
LAB_002dc8b7:
  if ((uVar2 != 0) && (pbVar5 != pbVar1)) {
    if (flags->_M_string_length != 0) {
      std::__cxx11::string::append((char *)flags);
    }
    std::__cxx11::string::_M_append((char *)flags,(ulong)(newFlags->_M_dataplus)._M_p);
    return;
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags,
                                   const std::string& newFlags) const
{
  bool allSpaces = std::all_of(newFlags.begin(), newFlags.end(), cmIsSpace);

  if (!newFlags.empty() && !allSpaces) {
    if (!flags.empty()) {
      flags += " ";
    }
    flags += newFlags;
  }
}